

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O0

void __thiscall spvtools::Context::SetMessageConsumer(Context *this,MessageConsumer *consumer)

{
  spv_context context;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_38;
  MessageConsumer *local_18;
  MessageConsumer *consumer_local;
  Context *this_local;
  
  context = this->context_;
  local_18 = consumer;
  consumer_local = (MessageConsumer *)this;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&local_38,consumer);
  SetContextMessageConsumer(context,&local_38);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_38);
  return;
}

Assistant:

void Context::SetMessageConsumer(MessageConsumer consumer) {
  SetContextMessageConsumer(context_, std::move(consumer));
}